

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPChunk ** MuxGetChunkListFromId(WebPMux *mux,WebPChunkId id)

{
  long lVar1;
  
  if (id < WEBP_CHUNK_UNKNOWN) {
    lVar1 = *(long *)(&DAT_001af178 + (ulong)id * 8);
  }
  else {
    lVar1 = 0x30;
  }
  return (WebPChunk **)((long)&mux->images + lVar1);
}

Assistant:

WebPChunk** MuxGetChunkListFromId(const WebPMux* mux, WebPChunkId id) {
  assert(mux != NULL);
  switch (id) {
    case WEBP_CHUNK_VP8X:    return (WebPChunk**)&mux->vp8x;
    case WEBP_CHUNK_ICCP:    return (WebPChunk**)&mux->iccp;
    case WEBP_CHUNK_ANIM:    return (WebPChunk**)&mux->anim;
    case WEBP_CHUNK_EXIF:    return (WebPChunk**)&mux->exif;
    case WEBP_CHUNK_XMP:     return (WebPChunk**)&mux->xmp;
    default:                 return (WebPChunk**)&mux->unknown;
  }
}